

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void * SyMemBackendDup(SyMemBackend *pBackend,void *pSrc,sxu32 nSize)

{
  void *pDest;
  
  pDest = SyMemBackendAlloc(pBackend,nSize);
  if (pDest != (void *)0x0) {
    SyMemcpy(pSrc,pDest,nSize);
  }
  return pDest;
}

Assistant:

JX9_PRIVATE void * SyMemBackendDup(SyMemBackend *pBackend, const void *pSrc, sxu32 nSize)
{
	void *pNew;
#if defined(UNTRUST)
	if( pSrc == 0 || nSize <= 0 ){
		return 0;
	}
#endif
	pNew = SyMemBackendAlloc(&(*pBackend), nSize);
	if( pNew ){
		SyMemcpy(pSrc, pNew, nSize);
	}
	return pNew;
}